

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  long *plVar3;
  string *psVar4;
  size_type *psVar5;
  string local_68;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TVar2 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  if ((int)TVar2 < 5) {
    cmGeneratorTarget::GetCompilePDBPath(&local_68,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    paVar1 = &local_68.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (__return_storage_ptr__->_M_string_length == 0) {
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_48,this->GeneratorTarget);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_68.field_2._M_allocated_capacity = *psVar5;
        local_68.field_2._8_8_ = plVar3[3];
        local_68._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar5;
        local_68._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_68._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      TVar2 = cmGeneratorTarget::GetType(this->GeneratorTarget);
      if (TVar2 == STATIC_LIBRARY) {
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(psVar4->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::ComputeTargetCompilePDB() const
{
  std::string compilePdbPath;
  if (this->GeneratorTarget->GetType() > cmStateEnums::OBJECT_LIBRARY) {
    return compilePdbPath;
  }
  compilePdbPath =
    this->GeneratorTarget->GetCompilePDBPath(this->GetConfigName());
  if (compilePdbPath.empty()) {
    // Match VS default: `$(IntDir)vc$(PlatformToolsetVersion).pdb`.
    // A trailing slash tells the toolchain to add its default file name.
    compilePdbPath = this->GeneratorTarget->GetSupportDirectory() + "/";
    if (this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY) {
      // Match VS default for static libs: `$(IntDir)$(ProjectName).pdb`.
      compilePdbPath += this->GeneratorTarget->GetName();
      compilePdbPath += ".pdb";
    }
  }

  return compilePdbPath;
}